

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall
aeron::Image::Image(Image *this,int32_t sessionId,int64_t correlationId,
                   int64_t subscriptionRegistrationId,string *sourceIdentity,
                   UnsafeBufferPosition *subscriberPosition,
                   shared_ptr<aeron::LogBuffers> *logBuffers,exception_handler_t *exceptionHandler)

{
  length_t *plVar1;
  int32_t iVar2;
  uint uVar3;
  element_type *peVar4;
  int64_t iVar5;
  int iVar6;
  long lVar7;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_0016e800;
  std::array<aeron::concurrent::AtomicBuffer,_3UL>::array(&this->m_termBuffers);
  peVar4 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  plVar1 = &peVar4->m_buffers[0].m_length;
  iVar6 = 0;
  if (*plVar1 != 0) {
    for (; (*plVar1 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
    }
  }
  iVar2 = *(int32_t *)(peVar4->m_buffers[3].m_buffer + 0x108);
  (this->m_header).m_context = this;
  (this->m_header).m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016e198;
  (this->m_header).m_buffer.m_buffer = (uint8_t *)0x0;
  (this->m_header).m_buffer.m_length = 0;
  (this->m_header).m_offset = 0;
  (this->m_header).m_initialTermId = iVar2;
  (this->m_header).m_positionBitsToShift = iVar6;
  concurrent::status::UnsafeBufferPosition::UnsafeBufferPosition
            ((UnsafeBufferPosition *)&this->m_subscriberPosition,subscriberPosition);
  std::__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
             ,&logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&this->m_sourceIdentity,(string *)sourceIdentity);
  (this->m_isClosed)._M_base._M_i = false;
  std::function<void_(const_std::exception_&)>::function(&this->m_exceptionHandler,exceptionHandler)
  ;
  this->m_correlationId = correlationId;
  this->m_subscriptionRegistrationId = subscriptionRegistrationId;
  this->m_sessionId = sessionId;
  for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 0x18) {
    peVar4 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(undefined4 *)((long)&(this->m_termBuffers)._M_elems[0].m_length + lVar7) =
         *(undefined4 *)((long)&peVar4->m_buffers[0].m_length + lVar7);
    *(undefined8 *)((long)&(this->m_termBuffers)._M_elems[0].m_buffer + lVar7) =
         *(undefined8 *)((long)&peVar4->m_buffers[0].m_buffer + lVar7);
  }
  uVar3 = (this->m_termBuffers)._M_elems[0].m_length;
  iVar5 = *(int64_t *)((subscriberPosition->m_buffer).m_buffer + subscriberPosition->m_offset);
  this->m_joinPosition = iVar5;
  this->m_finalPosition = iVar5;
  this->m_termLengthMask = uVar3 - 1;
  iVar6 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar6;
  this->m_isEos = false;
  return;
}

Assistant:

Image(
        std::int32_t sessionId,
        std::int64_t correlationId,
        std::int64_t subscriptionRegistrationId,
        const std::string& sourceIdentity,
        UnsafeBufferPosition& subscriberPosition,
        std::shared_ptr<LogBuffers> logBuffers,
        const exception_handler_t& exceptionHandler) :
        m_header(
            LogBufferDescriptor::initialTermId(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
            logBuffers->atomicBuffer(0).capacity(),
            this),
        m_subscriberPosition(subscriberPosition),
        m_logBuffers(logBuffers),
        m_sourceIdentity(sourceIdentity),
        m_isClosed(false),
        m_exceptionHandler(exceptionHandler),
        m_correlationId(correlationId),
        m_subscriptionRegistrationId(subscriptionRegistrationId),
        m_sessionId(sessionId)
    {
        for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
        {
            m_termBuffers[i] = logBuffers->atomicBuffer(i);
        }

        const util::index_t capacity = m_termBuffers[0].capacity();

        m_joinPosition = subscriberPosition.get();
        m_finalPosition = m_joinPosition;
        m_termLengthMask = capacity - 1;
        m_positionBitsToShift = BitUtil::numberOfTrailingZeroes(capacity);
        m_isEos = false;
    }